

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O3

Pass * wasm::createDataFlowOptsPass(void)

{
  Pass *__s;
  
  __s = (Pass *)operator_new(0x390);
  memset(__s,0,0x390);
  (__s->name)._M_dataplus._M_p = (pointer)&(__s->name).field_2;
  (__s->name).field_2._M_local_buf[0] = '\0';
  __s[1]._vptr_Pass = (_func_int **)0x0;
  __s[1].runner = (PassRunner *)0x0;
  __s[3]._vptr_Pass = (_func_int **)0x0;
  __s[3].runner = (PassRunner *)0x0;
  __s[3].name._M_dataplus._M_p = (pointer)0x0;
  __s[3].name._M_string_length = 0;
  __s[3].name.field_2._M_allocated_capacity = 0;
  __s->_vptr_Pass = (_func_int **)&PTR__DataFlowOpts_01071e70;
  *(Pass **)((long)&__s[3].name.field_2 + 8) = __s + 4;
  __s[3].passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (pointer)0x1;
  __s[3].passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = 0;
  *(undefined8 *)
   ((long)&__s[3].passArg.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 0x10) = 0;
  *(undefined4 *)
   ((long)&__s[3].passArg.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 0x18) = 0x3f800000;
  *(undefined8 *)
   &__s[3].passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = 0;
  __s[4]._vptr_Pass = (_func_int **)0x0;
  __s[4].runner =
       (PassRunner *)
       ((long)&__s[4].passArg.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload + 8);
  __s[4].name._M_dataplus._M_p = (pointer)0x1;
  __s[4].name._M_string_length = 0;
  __s[4].name.field_2._M_allocated_capacity = 0;
  *(undefined4 *)((long)&__s[4].name.field_2 + 8) = 0x3f800000;
  __s[4].passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (pointer)0x0;
  __s[4].passArg.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = 0;
  DataFlow::Graph::Graph
            ((Graph *)((long)&__s[4].passArg.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x10));
  return __s;
}

Assistant:

Pass* createDataFlowOptsPass() { return new DataFlowOpts(); }